

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O0

void __thiscall
anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>::Entry
          (Entry<anurbs::NurbsCurveGeometry<3L>_> *this,string *key,
          shared_ptr<anurbs::NurbsCurveGeometry<3L>_> *data,
          shared_ptr<anurbs::Attributes> *attributes)

{
  shared_ptr<anurbs::Attributes> *attributes_local;
  shared_ptr<anurbs::NurbsCurveGeometry<3L>_> *data_local;
  string *key_local;
  Entry<anurbs::NurbsCurveGeometry<3L>_> *this_local;
  
  EntryBase::EntryBase(&this->super_EntryBase);
  (this->super_EntryBase)._vptr_EntryBase = (_func_int **)&PTR_key_abi_cxx11__00777cb8;
  std::__cxx11::string::string((string *)&this->m_key,(string *)key);
  std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>::shared_ptr(&this->m_data,data);
  std::shared_ptr<anurbs::Attributes>::shared_ptr(&this->m_attributes,attributes);
  return;
}

Assistant:

Entry(const std::string& key, std::shared_ptr<TData> data,
        std::shared_ptr<Attributes> attributes)
        : m_key(key), m_data(data), m_attributes(attributes)
    {
    }